

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramAttacher::initAttachment
          (ShaderProgramAttacher *this,GLuint seed,GLuint shader)

{
  ContextWrapper *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *this_01;
  int precision;
  int precision_00;
  int precision_01;
  float fVar3;
  GLint compileStatus;
  string source;
  char *sourceStr;
  Random rnd;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate sourceTmpl;
  
  deRandom_init(&rnd.m_rnd,seed);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "#version 100\nvoid main() { gl_FragColor = vec4(${RED}, ${GREEN}, ${BLUE}, 1.0); }\n",
             (allocator<char> *)&sourceStr);
  tcu::StringTemplate::StringTemplate(&sourceTmpl,&source);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"RED",(allocator<char> *)&compileStatus);
  fVar3 = deRandom_getFloat(&rnd.m_rnd);
  de::floatToString_abi_cxx11_((string *)&sourceStr,(de *)0x4,fVar3,precision);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (&params,&source,(mapped_type *)&sourceStr);
  std::__cxx11::string::~string((string *)&sourceStr);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"GREEN",(allocator<char> *)&compileStatus);
  fVar3 = deRandom_getFloat(&rnd.m_rnd);
  de::floatToString_abi_cxx11_((string *)&sourceStr,(de *)0x4,fVar3,precision_00);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (&params,&source,(mapped_type *)&sourceStr);
  std::__cxx11::string::~string((string *)&sourceStr);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"BLUE",(allocator<char> *)&compileStatus);
  fVar3 = deRandom_getFloat(&rnd.m_rnd);
  de::floatToString_abi_cxx11_((string *)&sourceStr,(de *)0x4,fVar3,precision_01);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (&params,&source,(mapped_type *)&sourceStr);
  std::__cxx11::string::~string((string *)&sourceStr);
  std::__cxx11::string::~string((string *)&source);
  tcu::StringTemplate::specialize(&source,&sourceTmpl,&params);
  sourceStr = source._M_dataplus._M_p;
  this_00 = &(this->super_Attacher).super_ContextWrapper;
  glu::CallLogWrapper::glShaderSource
            (&this_00->super_CallLogWrapper,shader,1,&sourceStr,(GLint *)0x0);
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"glShaderSource(shader, 1, &sourceStr, DE_NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x1b0);
  glu::CallLogWrapper::glCompileShader(&this_00->super_CallLogWrapper,shader);
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  dVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(dVar2,"glCompileShader(shader)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x1b1);
  compileStatus = 0;
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0xa70))(shader,0x8b81,&compileStatus);
  if (compileStatus != 0) {
    std::__cxx11::string::~string((string *)&source);
    tcu::StringTemplate::~StringTemplate(&sourceTmpl);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,sourceStr,"compileStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x1b6);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderProgramAttacher::initAttachment (GLuint seed, GLuint shader)
{
	using					de::insert;
	using					de::floatToString;

	Random					rnd(seed);
	map<string, string>		params;
	const StringTemplate	sourceTmpl	(s_fragmentShaderTemplate);

	insert(params, "RED",	floatToString(rnd.getFloat(), 4));
	insert(params, "GREEN",	floatToString(rnd.getFloat(), 4));
	insert(params, "BLUE",	floatToString(rnd.getFloat(), 4));

	{
		const string			source		= sourceTmpl.specialize(params);
		const char* const		sourceStr	= source.c_str();

		GLU_CHECK_CALL_ERROR(glShaderSource(shader, 1, &sourceStr, DE_NULL), gl().getError());
		GLU_CHECK_CALL_ERROR(glCompileShader(shader), gl().getError());

		{
			GLint compileStatus = 0;
			gl().getShaderiv(shader, GL_COMPILE_STATUS, &compileStatus);
			TCU_CHECK_MSG(compileStatus != 0, sourceStr);
		}
	}
}